

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

String * __thiscall
Rml::PropertySpecification::PropertiesToString_abi_cxx11_
          (String *__return_storage_ptr__,PropertySpecification *this,PropertyDictionary *dictionary
          ,bool include_name,char delimiter)

{
  pointer this_00;
  bool bVar1;
  size_type __n;
  reference __x;
  iterator __first;
  iterator __last;
  reference pPVar2;
  pointer ppVar3;
  IdNameMap<Rml::PropertyId> *this_01;
  String *__lhs;
  ulong uVar4;
  const_iterator cVar5;
  String local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  const_iterator local_d8;
  Property *local_c8;
  Property *p;
  iterator iStack_b8;
  PropertyId id;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<PropertyId> *__range1_1;
  pair<Rml::PropertyId,_Rml::Property> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  PropertyMap *__range1;
  undefined1 local_48 [8];
  Vector<PropertyId> ids;
  PropertyMap *properties;
  char delimiter_local;
  bool include_name_local;
  PropertyDictionary *dictionary_local;
  PropertySpecification *this_local;
  String *result;
  
  ids.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)PropertyDictionary::GetProperties(dictionary)
  ;
  ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::vector
            ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48);
  __n = robin_hood::detail::
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::size((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                *)ids.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::reserve
            ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48,__n);
  this_00 = ids.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  cVar5 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::begin((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   *)ids.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  __end1.mInfo = (uint8_t *)cVar5.mKeyVals;
  cVar5 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::end((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 *)this_00);
  while( true ) {
    __end1.mKeyVals = (NodePtr)cVar5.mInfo;
    pair = &(cVar5.mKeyVals)->mData;
    bVar1 = robin_hood::detail::
            Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
            ::Iter<true>::operator!=((Iter<true> *)&__end1.mInfo,(Iter<true> *)&pair);
    if (!bVar1) break;
    __x = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::Iter<true>::operator*((Iter<true> *)&__end1.mInfo);
    ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::push_back
              ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48,&__x->first);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++((Iter<true> *)&__end1.mInfo);
    cVar5.mInfo = (uint8_t *)__end1.mKeyVals;
    cVar5.mKeyVals = (NodePtr)pair;
  }
  __first = ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::begin
                      ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48);
  __last = ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::end
                     ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48);
  ::std::
  sort<__gnu_cxx::__normal_iterator<Rml::PropertyId*,std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>>>
            ((__normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
              )__first._M_current,
             (__normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
              )__last._M_current);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1_1 = ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::begin
                       ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48);
  iStack_b8 = ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::end
                        ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff48);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
             ::operator*(&__end1_1);
    p._7_1_ = *pPVar2;
    cVar5 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::find((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                    *)ids.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)((long)&p + 7));
    local_d8 = cVar5;
    ppVar3 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::Iter<true>::operator->(&local_d8);
    local_c8 = &ppVar3->second;
    if (include_name) {
      this_01 = &::std::
                 unique_ptr<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>::
                 operator->(&this->property_map)->super_IdNameMap<Rml::PropertyId>;
      __lhs = IdNameMap<Rml::PropertyId>::GetName_abi_cxx11_(this_01,p._7_1_);
      ::std::operator+(&local_f8,__lhs,": ");
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    Property::ToString_abi_cxx11_(&local_138,local_c8);
    ::std::operator+(&local_118,&local_138,delimiter);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_138);
    __gnu_cxx::
    __normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
    ::operator++(&__end1_1);
  }
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    ::std::__cxx11::string::pop_back();
  }
  ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::~vector
            ((vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

String PropertySpecification::PropertiesToString(const PropertyDictionary& dictionary, bool include_name, char delimiter) const
{
	const PropertyMap& properties = dictionary.GetProperties();

	// For determinism we print the strings in order of increasing property ids.
	Vector<PropertyId> ids;
	ids.reserve(properties.size());
	for (auto& pair : properties)
		ids.push_back(pair.first);

	std::sort(ids.begin(), ids.end());

	String result;
	for (PropertyId id : ids)
	{
		const Property& p = properties.find(id)->second;
		if (include_name)
			result += property_map->GetName(id) + ": ";
		result += p.ToString() + delimiter;
	}

	if (!result.empty())
		result.pop_back();

	return result;
}